

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.h
# Opt level: O0

void __thiscall cppcms::widgets::numeric<int>::~numeric(numeric<int> *this,void **vtt)

{
  undefined8 *in_RSI;
  base_html_input *in_RDI;
  
  in_RDI->_vptr_base_html_input = (_func_int **)*in_RSI;
  *(undefined8 *)((long)&in_RDI->_vptr_base_html_input + (long)in_RDI->_vptr_base_html_input[-3]) =
       in_RSI[3];
  std::__cxx11::string::~string((string *)&in_RDI->field_0x40);
  cppcms::widgets::base_html_input::~base_html_input(in_RDI);
  return;
}

Assistant:

numeric() :
				base_html_input("text"),
				check_low_(false),
				check_high_(false),
				non_empty_(false)
			{
			}